

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O3

void __thiscall
soul::
ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
::clear(ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        *this)

{
  long *plVar1;
  ulong uVar2;
  long *plVar3;
  long lVar4;
  ulong uVar5;
  
  uVar2 = this->numActive;
  if (uVar2 != 0) {
    lVar4 = 0x10;
    uVar5 = 0;
    do {
      plVar1 = *(long **)((long)this->items + lVar4 + -0x10);
      plVar3 = (long *)((long)&(this->items->_M_dataplus)._M_p + lVar4);
      if (plVar3 != plVar1) {
        operator_delete(plVar1,*plVar3 + 1);
        uVar2 = this->numActive;
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x20;
    } while (uVar5 < uVar2);
  }
  this->numActive = 0;
  if (8 < this->numAllocated) {
    if (this->items != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete__(this->items);
    }
    this->items = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this->space;
    this->numAllocated = 8;
  }
  return;
}

Assistant:

void clear() noexcept
    {
        for (size_t i = 0; i < numActive; ++i)
            items[i].~Item();

        numActive = 0;
        freeIfHeapAllocated();
    }